

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

bool __thiscall VmBlock::HasExternalInstructionUsers(VmBlock *this)

{
  uint uVar1;
  VmValue **ppVVar2;
  VmInstruction *pVVar3;
  VmInstruction *instUser;
  VmInstruction *pVStack_20;
  uint i;
  VmInstruction *curr;
  VmBlock *this_local;
  
  pVStack_20 = this->firstInstruction;
  do {
    if (pVStack_20 == (VmInstruction *)0x0) {
      return false;
    }
    for (instUser._4_4_ = 0;
        uVar1 = SmallArray<VmValue_*,_8U>::size(&(pVStack_20->super_VmValue).users),
        instUser._4_4_ < uVar1; instUser._4_4_ = instUser._4_4_ + 1) {
      ppVVar2 = SmallArray<VmValue_*,_8U>::operator[]
                          (&(pVStack_20->super_VmValue).users,instUser._4_4_);
      pVVar3 = getType<VmInstruction>(*ppVVar2);
      if ((pVVar3 != (VmInstruction *)0x0) && (pVVar3->parent != this)) {
        return true;
      }
    }
    pVStack_20 = pVStack_20->nextSibling;
  } while( true );
}

Assistant:

bool VmBlock::HasExternalInstructionUsers()
{
	for(VmInstruction *curr = firstInstruction; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			if(VmInstruction *instUser = getType<VmInstruction>(curr->users[i]))
			{
				if(instUser->parent != this)
					return true;
			}
		}
	}

	return false;
}